

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O2

void __thiscall CNetMessage::CNetMessage(CNetMessage *this,CNetMessage *param_1)

{
  long lVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::DataStream(&this->m_recv,&param_1->m_recv);
  uVar2 = *(undefined4 *)((long)&(param_1->m_time).__r + 4);
  uVar3 = param_1->m_message_size;
  uVar4 = param_1->m_raw_message_size;
  *(int *)&(this->m_time).__r = (int)(param_1->m_time).__r;
  *(undefined4 *)((long)&(this->m_time).__r + 4) = uVar2;
  this->m_message_size = uVar3;
  this->m_raw_message_size = uVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::string((string *)&this->m_type,&param_1->m_type);
    return;
  }
  __stack_chk_fail();
}

Assistant:

CNetMessage(CNetMessage&&) = default;